

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fire.hpp
# Opt level: O2

void fire::_instant_assert(bool pass,string *msg,bool programmer_side)

{
  ostream *poVar1;
  undefined7 in_register_00000039;
  
  if ((int)CONCAT71(in_register_00000039,pass) != 0) {
    return;
  }
  if (msg->_M_string_length != 0) {
    std::operator<<((ostream *)&std::cerr,"Error");
    if (programmer_side) {
      std::operator<<((ostream *)&std::cerr," (programmer side)");
    }
    poVar1 = std::operator<<((ostream *)&std::cerr,": ");
    poVar1 = std::operator<<(poVar1,(string *)msg);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  exit(1);
}

Assistant:

void _instant_assert(bool pass, const std::string &msg, bool programmer_side) {
        if (pass)
            return;

        if (!msg.empty()) {
            std::cerr << "Error";
            if(programmer_side)
                std::cerr << " (programmer side)";
            std::cerr << ": " << msg << std::endl;
        }

        exit(_failure_code);
    }